

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_50;
  sockaddr_in check_addr;
  sockaddr_in compare_addr;
  char check_ip [17];
  
  check_addr._0_4_ = *(undefined4 *)addr;
  check_addr.sin_addr.s_addr = *(in_addr_t *)(addr->sa_data + 2);
  check_addr.sin_zero._0_4_ = *(undefined4 *)(addr->sa_data + 6);
  check_addr.sin_zero._4_4_ = *(undefined4 *)(addr->sa_data + 10);
  iVar1 = uv_ip4_addr(compare_ip,compare_port,&compare_addr);
  if (iVar1 == 0) {
    if (check_addr.sin_family == 2) {
      if (compare_addr.sin_family == 2) {
        if (check_addr.sin_addr.s_addr == compare_addr.sin_addr.s_addr) {
          if ((compare_port == 0) || (check_addr.sin_port == compare_addr.sin_port)) {
            iVar1 = uv_ip4_name(&check_addr,check_ip,0x11);
            if (iVar1 == 0) {
              printf("%s: %s:%d\n",context,check_ip,
                     (ulong)(ushort)(check_addr.sin_port << 8 | check_addr.sin_port >> 8));
              return;
            }
            pcVar2 = "r == 0";
            uStack_50 = 0x65;
          }
          else {
            pcVar2 = "compare_port == 0 || check_addr.sin_port == compare_addr.sin_port";
            uStack_50 = 0x62;
          }
        }
        else {
          pcVar2 = 
          "memcmp(&check_addr.sin_addr, &compare_addr.sin_addr, sizeof compare_addr.sin_addr) == 0";
          uStack_50 = 0x5f;
        }
      }
      else {
        pcVar2 = "compare_addr.sin_family == AF_INET";
        uStack_50 = 0x5a;
      }
    }
    else {
      pcVar2 = "check_addr.sin_family == AF_INET";
      uStack_50 = 0x59;
    }
  }
  else {
    pcVar2 = "0 == uv_ip4_addr(compare_ip, compare_port, &compare_addr)";
    uStack_50 = 0x56;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
          ,uStack_50,pcVar2);
  abort();
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT(0 == uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT(check_addr.sin_family == AF_INET);
  ASSERT(compare_addr.sin_family == AF_INET);

  /* Check if the ip matches */
  ASSERT(memcmp(&check_addr.sin_addr,
         &compare_addr.sin_addr,
         sizeof compare_addr.sin_addr) == 0);

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT(r == 0);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}